

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status kwssys::SystemTools::GetPermissions(char *file,mode_t *mode)

{
  char *in_RDI;
  mode_t *in_stack_00000020;
  string *in_stack_00000028;
  undefined8 in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [48];
  Status local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = Status::POSIX((int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,in_RDI,&local_39);
    local_8 = GetPermissions(in_stack_00000028,in_stack_00000020);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return local_8;
}

Assistant:

Status SystemTools::GetPermissions(const char* file, mode_t& mode)
{
  if (!file) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::GetPermissions(std::string(file), mode);
}